

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,OPJ_UINT32 p_tp_num,
                   OPJ_INT32 p_tp_pos,OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode,
                   opj_event_mgr_t *p_manager)

{
  OPJ_UINT16 OVar1;
  int iVar2;
  uint uVar3;
  OPJ_BOOL OVar4;
  opj_pi_iterator_t *pi;
  opj_packet_info_t *poVar5;
  OPJ_UINT32 OVar6;
  long lVar7;
  opj_cp_t *cp;
  OPJ_UINT32 pino;
  opj_pi_iterator_t *poVar8;
  OPJ_UINT32 length;
  OPJ_UINT32 local_78;
  OPJ_BOOL local_74;
  opj_pi_iterator_t *local_70;
  ulong local_68;
  OPJ_UINT32 local_60;
  uint local_5c;
  opj_cp_t *local_58;
  opj_tcp_t *local_50;
  opj_tcd_tile_t *local_48;
  OPJ_UINT32 *local_40;
  OPJ_UINT32 local_38;
  OPJ_UINT32 local_34;
  
  local_58 = p_t2->cp;
  local_50 = local_58->tcps + p_tile_no;
  OVar1 = local_58->rsiz;
  if ((local_58->m_specific_param).m_dec.m_reduce == 0) {
    local_60 = 1;
  }
  else {
    local_60 = p_t2->image->numcomps;
  }
  OVar6 = local_50->numpocs;
  local_48 = p_tile;
  local_40 = p_data_written;
  pi = opj_pi_initialise_encode(p_t2->image,local_58,p_tile_no,p_t2_mode);
  if (pi == (opj_pi_iterator_t *)0x0) {
    local_74 = 0;
  }
  else {
    local_68 = (ulong)p_max_len;
    local_38 = OVar6 + 1;
    *local_40 = 0;
    local_70 = pi;
    if (p_t2_mode == THRESH_CALC) {
      local_34 = (OVar1 == 4) + 1;
      cp = local_58;
      for (OVar6 = 0; OVar6 != local_60; OVar6 = OVar6 + 1) {
        local_5c = 0;
        poVar8 = pi;
        for (pino = 0; pino != local_34; pino = pino + 1) {
          opj_pi_create_encode(pi,cp,p_tile_no,pino,OVar6,p_tp_pos,THRESH_CALC);
          local_74 = 0;
          pi = local_70;
          if ((poVar8->poc).prg == OPJ_PROG_UNKNOWN) goto LAB_001314ea;
          while (OVar4 = opj_pi_next(poVar8), OVar4 != 0) {
            if (poVar8->layno < p_maxlayers) {
              local_78 = 0;
              length = (OPJ_UINT32)local_68;
              OVar4 = opj_t2_encode_packet
                                (p_tile_no,local_48,local_50,poVar8,p_dest,&local_78,length,
                                 cstr_info,THRESH_CALC,p_manager);
              pi = local_70;
              if (OVar4 == 0) goto LAB_001314ea;
              local_5c = local_5c + local_78;
              p_dest = p_dest + local_78;
              local_68 = (ulong)(length - local_78);
              *local_40 = *local_40 + local_78;
            }
          }
          uVar3 = (local_58->m_specific_param).m_dec.m_reduce;
          pi = local_70;
          if (uVar3 != 0 && uVar3 < local_5c) goto LAB_001314ea;
          poVar8 = poVar8 + 1;
          cp = local_58;
        }
      }
      local_74 = 1;
    }
    else {
      opj_pi_create_encode(pi,local_58,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
      local_74 = 0;
      pi = local_70;
      if (local_70[p_pino].poc.prg != OPJ_PROG_UNKNOWN) {
        poVar8 = local_70 + p_pino;
        while (OVar4 = opj_pi_next(poVar8), OVar4 != 0) {
          if (poVar8->layno < p_maxlayers) {
            local_78 = 0;
            OVar4 = opj_t2_encode_packet
                              (p_tile_no,local_48,local_50,poVar8,p_dest,&local_78,
                               (OPJ_UINT32)local_68,cstr_info,p_t2_mode,p_manager);
            pi = local_70;
            if (OVar4 == 0) goto LAB_001314ea;
            *local_40 = *local_40 + local_78;
            if (cstr_info != (opj_codestream_info_t *)0x0) {
              iVar2 = cstr_info->packno;
              if (cstr_info->index_write != 0) {
                poVar5 = cstr_info->tile[p_tile_no].packet + iVar2;
                if (iVar2 == 0) {
                  lVar7 = (long)cstr_info->tile[p_tile_no].end_header;
LAB_00131495:
                  lVar7 = lVar7 + 1;
                }
                else if (((((byte)local_50->field_0x1638 >> 2 |
                           *(byte *)((long)&local_58->m_specific_param + 0x11) >> 3) & 1) == 0) ||
                        (lVar7 = poVar5->start_pos, lVar7 == 0)) {
                  lVar7 = poVar5[-1].end_pos;
                  goto LAB_00131495;
                }
                poVar5->start_pos = lVar7;
                poVar5->end_pos = (ulong)local_78 + lVar7 + -1;
                poVar5->end_ph_pos = lVar7 + poVar5->end_ph_pos + -1;
              }
              cstr_info->packno = iVar2 + 1;
            }
            p_dest = p_dest + local_78;
            local_68 = (ulong)((int)local_68 - local_78);
            local_48->packno = local_48->packno + 1;
          }
        }
        local_74 = 1;
        pi = local_70;
      }
    }
LAB_001314ea:
    opj_pi_destroy(pi,local_38);
  }
  return local_74;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets(opj_t2_t* p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_UINT32 p_maxlayers,
                               OPJ_BYTE *p_dest,
                               OPJ_UINT32 * p_data_written,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_info_t *cstr_info,
                               OPJ_UINT32 p_tp_num,
                               OPJ_INT32 p_tp_pos,
                               OPJ_UINT32 p_pino,
                               J2K_T2_MODE p_t2_mode,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_dest;
    OPJ_UINT32 l_nb_bytes = 0;
    OPJ_UINT32 compno;
    OPJ_UINT32 poc;
    opj_pi_iterator_t *l_pi = 00;
    opj_pi_iterator_t *l_current_pi = 00;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
    OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K) ? 2 : 1;
    OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ?
                            l_image->numcomps : 1;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

    l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode);
    if (!l_pi) {
        return OPJ_FALSE;
    }

    * p_data_written = 0;

    if (p_t2_mode == THRESH_CALC) { /* Calculating threshold */
        l_current_pi = l_pi;

        for (compno = 0; compno < l_max_comp; ++compno) {
            OPJ_UINT32 l_comp_len = 0;
            l_current_pi = l_pi;

            for (poc = 0; poc < pocno ; ++poc) {
                OPJ_UINT32 l_tp_num = compno;

                /* TODO MSD : check why this function cannot fail (cf. v1) */
                opj_pi_create_encode(l_pi, l_cp, p_tile_no, poc, l_tp_num, p_tp_pos, p_t2_mode);

                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                    if (l_current_pi->layno < p_maxlayers) {
                        l_nb_bytes = 0;

                        if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                                   l_current_data, &l_nb_bytes,
                                                   p_max_len, cstr_info,
                                                   p_t2_mode,
                                                   p_manager)) {
                            opj_pi_destroy(l_pi, l_nb_pocs);
                            return OPJ_FALSE;
                        }

                        l_comp_len += l_nb_bytes;
                        l_current_data += l_nb_bytes;
                        p_max_len -= l_nb_bytes;

                        * p_data_written += l_nb_bytes;
                    }
                }

                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                    if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                        opj_pi_destroy(l_pi, l_nb_pocs);
                        return OPJ_FALSE;
                    }
                }

                ++l_current_pi;
            }
        }
    } else { /* t2_mode == FINAL_PASS  */
        opj_pi_create_encode(l_pi, l_cp, p_tile_no, p_pino, p_tp_num, p_tp_pos,
                             p_t2_mode);

        l_current_pi = &l_pi[p_pino];
        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }
        while (opj_pi_next(l_current_pi)) {
            if (l_current_pi->layno < p_maxlayers) {
                l_nb_bytes = 0;

                if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                           l_current_data, &l_nb_bytes, p_max_len,
                                           cstr_info, p_t2_mode, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }

                l_current_data += l_nb_bytes;
                p_max_len -= l_nb_bytes;

                * p_data_written += l_nb_bytes;

                /* INDEX >> */
                if (cstr_info) {
                    if (cstr_info->index_write) {
                        opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                        opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                        if (!cstr_info->packno) {
                            info_PK->start_pos = info_TL->end_header + 1;
                        } else {
                            info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC) &&
                                                  info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno -
                                                                            1].end_pos + 1;
                        }
                        info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                        info_PK->end_ph_pos += info_PK->start_pos -
                                               1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                    }

                    cstr_info->packno++;
                }
                /* << INDEX */
                ++p_tile->packno;
            }
        }
    }

    opj_pi_destroy(l_pi, l_nb_pocs);

    return OPJ_TRUE;
}